

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O3

void CB_EXPLORE::predict_or_learn_first<true>(cb_explore *data,single_learner *base,example *ec)

{
  float *pfVar1;
  uint32_t uVar2;
  size_t sVar3;
  uint uVar4;
  action_scores probs;
  action_score local_64;
  float local_5c;
  v_array<ACTION_SCORE::action_score> local_58;
  
  local_58._begin = (ec->pred).a_s._begin;
  local_58._end = (action_score *)(ec->pred).scalars._end;
  local_58.end_array._0_4_ = *(undefined4 *)((long)&ec->pred + 0x10);
  local_58.end_array._4_4_ = *(undefined4 *)((long)&ec->pred + 0x14);
  local_58.erase_count._0_4_ = *(undefined4 *)((long)&ec->pred + 0x18);
  local_58.erase_count._4_4_ = *(undefined4 *)((long)&ec->pred + 0x1c);
  pfVar1 = &((ec->l).cs.costs._begin)->partial_prediction;
  (**(code **)(base + (ulong)(1.0 < *pfVar1 || *pfVar1 == 1.0) * 8 + 0x28))
            (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20));
  v_array<ACTION_SCORE::action_score>::clear(&local_58);
  sVar3 = data->tau;
  if (sVar3 == 0) {
    uVar2 = (ec->pred).multiclass;
    if ((data->cbcs).num_actions != 0) {
      uVar4 = 0;
      do {
        local_64.score = 0.0;
        local_64.action = uVar4;
        v_array<ACTION_SCORE::action_score>::push_back(&local_58,&local_64);
        uVar4 = uVar4 + 1;
      } while (uVar4 < (data->cbcs).num_actions);
    }
    local_58._begin[uVar2 - 1].score = 1.0;
  }
  else {
    uVar4 = (data->cbcs).num_actions;
    if (uVar4 != 0) {
      local_5c = 1.0 / (float)uVar4;
      uVar4 = 0;
      do {
        local_64.action = uVar4;
        local_64.score = local_5c;
        v_array<ACTION_SCORE::action_score>::push_back(&local_58,&local_64);
        uVar4 = uVar4 + 1;
      } while (uVar4 < (data->cbcs).num_actions);
      sVar3 = data->tau;
    }
    data->tau = sVar3 - 1;
  }
  (ec->pred).scalars.end_array =
       (float *)CONCAT44(local_58.end_array._4_4_,local_58.end_array._0_4_);
  (ec->pred).scalars.erase_count =
       CONCAT44(local_58.erase_count._4_4_,(undefined4)local_58.erase_count);
  (ec->pred).a_s._begin = local_58._begin;
  (ec->pred).scalars._end = (float *)local_58._end;
  return;
}

Assistant:

void predict_or_learn_first(cb_explore& data, single_learner& base, example& ec)
{
  // Explore tau times, then act according to optimal.
  action_scores probs = ec.pred.a_s;

  if (is_learn && ec.l.cb.costs[0].probability < 1)
    base.learn(ec);
  else
    base.predict(ec);

  probs.clear();
  if (data.tau > 0)
  {
    float prob = 1.f / (float)data.cbcs.num_actions;
    for (uint32_t i = 0; i < data.cbcs.num_actions; i++) probs.push_back({i, prob});
    data.tau--;
  }
  else
  {
    uint32_t chosen = ec.pred.multiclass - 1;
    for (uint32_t i = 0; i < data.cbcs.num_actions; i++) probs.push_back({i, 0.});
    probs[chosen].score = 1.0;
  }

  ec.pred.a_s = probs;
}